

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocations.cpp
# Opt level: O2

void ast::Relocations::relocate(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  byte bVar1;
  uint section;
  uint offset;
  long lVar2;
  Location *pLVar3;
  uint16_t uVar4;
  Value_type VVar5;
  uint uVar6;
  uint uVar7;
  undefined6 extraout_var;
  byte bVar8;
  string *__return_storage_ptr__;
  undefined8 *puVar9;
  allocator local_161;
  Location *local_160;
  undefined4 local_154;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar9 = &list_abi_cxx11_;
  do {
    while( true ) {
      puVar9 = (undefined8 *)*puVar9;
      if (puVar9 == &list_abi_cxx11_) {
        return;
      }
      lVar2 = puVar9[2];
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar2 + 0x28);
      if (*(long *)(lVar2 + 0x30) == 0) break;
      std::__cxx11::string::string((string *)&local_f0,(string *)__rhs);
      VVar5 = Symbols::get_type(&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      if (VVar5 != UNDEFINED) break;
      pLVar3 = *(Location **)(lVar2 + 8);
      std::operator+(&local_50,"Undefined symbol: ",__rhs);
      error_report(pLVar3,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    __return_storage_ptr__ = &local_150;
    section = *(uint *)(lVar2 + 0x10);
    offset = *(uint *)(lVar2 + 0x14);
    uVar4 = Sections::read16(section,offset);
    bVar1 = *(byte *)(lVar2 + 0x1c);
    local_154 = (undefined4)CONCAT62(extraout_var,uVar4);
    if (*(long *)(lVar2 + 0x30) == 0) {
      uVar6 = *(uint *)(lVar2 + 0x48);
    }
    else {
      std::__cxx11::string::string((string *)&local_110,(string *)__rhs);
      uVar6 = Symbols::get_section(&local_110);
      uVar6 = Sections::get_address(uVar6);
      uVar6 = uVar6 + *(int *)(lVar2 + 0x48);
      std::__cxx11::string::~string((string *)&local_110);
    }
    if (*(int *)(lVar2 + 0x20) == 2) {
      if ((uVar6 & 1) != 0) {
        pLVar3 = *(Location **)(lVar2 + 8);
        string_printf_abi_cxx11_
                  (&local_90,"Target address is odd: %+d (0x%x)",(ulong)uVar6,(ulong)uVar6);
        warning_report(pLVar3,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      uVar7 = Sections::get_address(section);
      uVar6 = uVar6 - (uVar7 + offset);
      if ((int)uVar6 < 0) {
        pLVar3 = *(Location **)(lVar2 + 8);
        std::__cxx11::string::string
                  ((string *)&local_b0,"Indicated address must be higher than current location",
                   &local_161);
        error_report(pLVar3,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      if (1 << ((char)*(undefined4 *)(lVar2 + 0x1c) + 1U & 0x1f) <= (int)uVar6) {
        local_160 = *(Location **)(lVar2 + 8);
        string_printf_abi_cxx11_
                  (&local_130,
                   "Interval between PC and target address: %+d (0x%x), isn\'t codable with %d bit",
                   (ulong)uVar6,(ulong)uVar6);
        error_report(local_160,&local_130);
        __return_storage_ptr__ = &local_130;
LAB_00121642:
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
LAB_00121647:
      uVar6 = (int)uVar6 >> 1;
    }
    else {
      if (*(int *)(lVar2 + 0x20) == 1) {
        if ((uVar6 & 1) != 0) {
          local_160 = *(Location **)(lVar2 + 8);
          string_printf_abi_cxx11_
                    (&local_70,"Target address is odd: %+d (0x%x)",(ulong)uVar6,(ulong)uVar6);
          warning_report(local_160,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
        }
        uVar7 = Sections::get_address(section);
        bVar8 = (byte)*(int *)(lVar2 + 0x1c);
        uVar6 = uVar6 - (uVar7 + offset);
        if ((int)uVar6 < -1 << (bVar8 & 0x1f) || 1 << (bVar8 & 0x1f) <= (int)uVar6) {
          pLVar3 = *(Location **)(lVar2 + 8);
          string_printf_abi_cxx11_
                    (__return_storage_ptr__,
                     "Interval between PC and target address: %+d (0x%x), isn\'t codable in %d bit two\'s complementxx"
                     ,(ulong)uVar6,(ulong)uVar6,(ulong)(*(int *)(lVar2 + 0x1c) + 1));
          error_report(pLVar3,__return_storage_ptr__);
          goto LAB_00121642;
        }
        goto LAB_00121647;
      }
      if (1 << ((byte)*(undefined4 *)(lVar2 + 0x1c) & 0x1f) < (int)uVar6) {
        local_160 = *(Location **)(lVar2 + 8);
        string_printf_abi_cxx11_
                  (&local_d0,"Expression\'s value: %d (0x%x) isn\'t codable in %d bit",(ulong)uVar6,
                   (ulong)uVar6);
        error_report(local_160,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
    }
    uVar7 = ~(-1 << (bVar1 & 0x1f));
    Sections::write16(section,offset,
                      (ushort)((uVar6 & uVar7) << (*(byte *)(lVar2 + 0x18) & 0x1f)) |
                      (ushort)local_154 & ~(ushort)(uVar7 << (*(byte *)(lVar2 + 0x18) & 0x1f)));
  } while( true );
}

Assistant:

void Relocations::relocate()
{
	for (auto reloc: list) {
		if ( ! reloc->symbol.empty()) {
			if (Symbols::get_type(reloc->symbol) == UNDEFINED) {
				error_report(reloc->exp_location, "Undefined symbol: " + reloc->symbol);
				continue;
			}
		}
		auto section = reloc->section_index;
		auto offset = reloc->section_offset;
		auto content = Sections::read16(section, offset);
		auto mask = MAKE_MASK(reloc->width, 0U);
		//  Saltos para endereços absolutos geram relocations relativas sem simbolo associado
		auto value = 0;	// Valor com sinal
		value = (reloc->symbol.empty() ? 0 : Sections::get_address(Symbols::get_section(reloc->symbol)))
				+ reloc->addend;
		if (reloc->type == Relocation::Relocation_type::RELATIVE) {
			// Nas instruções branch os offsets são codificados em número de instruções (value / 2)
			if (value & 1)
				warning_report(reloc->exp_location,
					string_printf("Target address is odd: %+d (0x%x)", value, value));
			value -= Sections::get_address(section) + offset;
			if (value >= (1 << reloc->width) || value < (~0 << reloc->width))	// signed
				error_report(reloc->exp_location,
						 string_printf("Interval between PC and target address: %+d (0x%x), "
								"isn't codable in %d bit two's complementxx",
								value, value, reloc->width + 1));
			value >>= 1;
		}
		else if (reloc->type == Relocation::Relocation_type::RELATIVE_UNSIGNED) {	// usado no ldr rd, label
			if (value & 1)
				warning_report(reloc->exp_location,
					string_printf("Target address is odd: %+d (0x%x)", value, value));
			value -= Sections::get_address(section) + offset;
			if (value < 0)
				error_report(reloc->exp_location,
							"Indicated address must be higher than current location");
			if (value >= (1 << (reloc->width + 1)))
				error_report(reloc->exp_location,
					string_printf("Interval between PC and target address: %+d (0x%x), "
							"isn't codable with %d bit",
							value, value, reloc->width + 1));
			value >>= 1;
		}
		else if (value > (1 << reloc->width)) { // Relocation::Type::ABSOLUTE
			error_report(reloc->exp_location,
				string_printf("Expression's value: %d (0x%x) isn't codable in %d bit",
					value, value, reloc->width));
		}
		content &= ~(mask << reloc->position);
		content |= (value & mask) << reloc->position;
		Sections::write16(section, offset, content);
	}
}